

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O1

string * __thiscall
absl::flags_internal::Unparse_abi_cxx11_
          (string *__return_storage_ptr__,flags_internal *this,unsigned_short v)

{
  Nonnull<char_*> pcVar1;
  char local_30 [32];
  
  pcVar1 = numbers_internal::FastIntToBuffer((int32_t)this,local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,local_30,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Unparse(unsigned short v) { return absl::StrCat(v); }